

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_commandline_tests.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  UnitTestSource *pUVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  int iVar4;
  unsigned_long *in_R9;
  char *targv [2];
  iuCodeMessage local_250;
  AssertionResult iutest_ar;
  int targc;
  string local_1f0;
  iuStreamMessage local_1d0;
  string local_48;
  
  iuutil::ReleaseDefaultXmlGenerator();
  targv[0] = *argv;
  targv[1] = "--gtest_foo";
  targc = 2;
  iutest::detail::InitIrisUnitTest<char_const**>(&targc,targv);
  local_1d0.m_stream.super_iu_stringstream._0_4_ = 2;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"2","targc",(char *)&local_1d0,&targc,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1d0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1d0.m_stream);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
               ,0x30,iutest_ar.m_message._M_dataplus._M_p);
    local_250._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,(Fixed *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_250);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1d0.m_stream);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x1000000);
  paVar1 = &iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
  if (!iutest_ar.m_result) {
    memset(&local_1d0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1d0.m_stream);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)&iutest_ar,
               (AssertionResult *)"::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
               "false","true",(char *)in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
               ,0x32,local_1f0._M_dataplus._M_p);
    local_250._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,(Fixed *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1d0.m_stream);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pUVar3 = iutest::UnitTestSource::GetInstance();
  iVar2 = iutest::UnitTestSource::Run(pUVar3);
  iVar4 = 1;
  if (iVar2 == 0) {
    targv[0] = *argv;
    targv[1] = "--iutest_foo";
    targc = 2;
    iutest::detail::InitIrisUnitTest<char_const**>(&targc,targv);
    local_1d0.m_stream.super_iu_stringstream._0_4_ = 2;
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)"2","targc",(char *)&local_1d0,&targc,(int *)in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_1d0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1d0.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
                 ,0x3b,iutest_ar.m_message._M_dataplus._M_p);
      local_250._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,(Fixed *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_250);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1d0.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x1000000);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_1d0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1d0.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1f0,(internal *)&iutest_ar,
                 (AssertionResult *)
                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","false","true",
                 (char *)in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
                 ,0x3c,local_1f0._M_dataplus._M_p);
      local_250._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,(Fixed *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_1f0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1d0.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    pUVar3 = iutest::UnitTestSource::GetInstance();
    iVar2 = iutest::UnitTestSource::Run(pUVar3);
    if (iVar2 == 0) {
      targv[0] = (char *)0x0;
      targv[1] = (char *)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_random_seed",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_repeat",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_stream_result_to",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_file_location",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_file_location=xxx",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_print_time",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_print_time=",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_catch_exceptions",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_color",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_color=hoge",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_shuffle=1",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_output",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_also_run_disabled_tests=1",
                 (allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_list_tests=1",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--iutest_list_tests_with_where=1",
                 (allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"--x",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"-x",(allocator<char> *)&local_250);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      iutest::InitIrisUnitTest<char>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)targv);
      local_250.m_message._M_dataplus._M_p._0_4_ = 0x11;
      local_1d0.m_stream.super_iu_stringstream._0_8_ = (long)targv[1] - (long)targv[0] >> 5;
      iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (&iutest_ar,(internal *)"17u","vargv.size()",(char *)&local_250,(uint *)&local_1d0,
                 in_R9);
      if (iutest_ar.m_result == false) {
        memset(&local_1d0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1d0.m_stream);
        iutest::
        PrintToString<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_48,(iutest *)targv,v);
        iutest::detail::iuStreamMessage::operator<<(&local_1d0,&local_48);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
                   ,0x53,iutest_ar.m_message._M_dataplus._M_p);
        local_250._44_4_ = 1;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,(Fixed *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_48);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1d0.m_stream);
      }
      std::__cxx11::string::~string((string *)&iutest_ar);
      iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x1000000);
      iutest_ar.m_message._M_string_length = 0;
      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
      if (!iutest_ar.m_result) {
        memset(&local_1d0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1d0.m_stream);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  (&local_1f0,(internal *)&iutest_ar,
                   (AssertionResult *)
                   "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","false","true",
                   (char *)in_R9);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
                   ,0x54,local_1f0._M_dataplus._M_p);
        local_250._44_4_ = 1;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_250,(Fixed *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_1f0);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1d0.m_stream);
      }
      std::__cxx11::string::~string((string *)&iutest_ar);
      pUVar3 = iutest::UnitTestSource::GetInstance();
      iVar2 = iutest::UnitTestSource::Run(pUVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)targv);
      if (iVar2 == 0) {
        puts("*** Successful ***");
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

    {
        int targc = 2;
        DECAL_ARGV("--gtest_foo");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(2, targc);
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
#endif
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#if !defined(IUTEST_USE_GTEST)
    {
        int targc = 2;
        DECAL_ARGV("--iutest_foo");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(2, targc);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_random_seed");
        vargv.push_back("--iutest_repeat");
        vargv.push_back("--iutest_stream_result_to");
        vargv.push_back("--iutest_file_location");
        vargv.push_back("--iutest_file_location=xxx");
        vargv.push_back("--iutest_print_time");
        vargv.push_back("--iutest_print_time=");
        vargv.push_back("--iutest_catch_exceptions");
        vargv.push_back("--iutest_color");
        vargv.push_back("--iutest_color=hoge");
        vargv.push_back("--iutest_shuffle=1");
        vargv.push_back("--iutest_output");
        vargv.push_back("--iutest_also_run_disabled_tests=1");
        vargv.push_back("--iutest_list_tests=1");
        vargv.push_back("--iutest_list_tests_with_where=1");
        vargv.push_back("--x");
        vargv.push_back("-x");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(17u, vargv.size()) << ::iutest::PrintToString(vargv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}